

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_thread.cxx
# Opt level: O0

int ndiEventWait(pl_cond_and_mutex_t *event,int milliseconds)

{
  int iVar1;
  undefined1 local_38 [8];
  timespec ts;
  timeval tv;
  int timedout;
  int milliseconds_local;
  pl_cond_and_mutex_t *event_local;
  
  tv.tv_usec._0_4_ = 0;
  if (milliseconds < 0) {
    pthread_mutex_lock((pthread_mutex_t *)&event->mutex);
    if (event->signalled == 0) {
      pthread_cond_wait((pthread_cond_t *)&event->cond,(pthread_mutex_t *)&event->mutex);
    }
    event->signalled = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&event->mutex);
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&event->mutex);
    if (event->signalled == 0) {
      gettimeofday((timeval *)&ts.tv_nsec,(__timezone_ptr_t)0x0);
      ts.tv_nsec = milliseconds / 1000 + ts.tv_nsec;
      tv.tv_sec = (milliseconds % 1000) * 1000 + tv.tv_sec;
      if (999999 < tv.tv_sec) {
        tv.tv_sec = tv.tv_sec + -1000000;
        ts.tv_nsec = ts.tv_nsec + 1;
      }
      local_38 = (undefined1  [8])ts.tv_nsec;
      ts.tv_sec = tv.tv_sec * 1000;
      iVar1 = pthread_cond_timedwait
                        ((pthread_cond_t *)&event->cond,(pthread_mutex_t *)&event->mutex,
                         (timespec *)local_38);
      tv.tv_usec._0_4_ = (uint)(iVar1 == 0x6e);
    }
    if ((uint)tv.tv_usec == 0) {
      event->signalled = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&event->mutex);
  }
  return (uint)tv.tv_usec;
}

Assistant:

ndicapiExport int ndiEventWait(pl_cond_and_mutex_t* event, int milliseconds)
{
  int timedout = 0;

  if (milliseconds < 0)   /* do infinite wait */
  {
    pthread_mutex_lock(&event->mutex);
    if (event->signalled == 0)
    {
      pthread_cond_wait(&event->cond, &event->mutex);
    }
    event->signalled = 0;
    pthread_mutex_unlock(&event->mutex);
  }
  else   /* do timed wait */
  {
    struct timeval tv;
    struct timespec ts;

    pthread_mutex_lock(&event->mutex);
    if (event->signalled == 0)
    {
      /* all the time stuff is used to check for timeouts */
      gettimeofday(&tv, 0);
      tv.tv_sec += milliseconds / 1000; /* msec to sec */
      tv.tv_usec += (milliseconds % 1000) * 1000; /* msec to usec */
      if (tv.tv_usec >= 1000000)   /* if usec overflow */
      {
        tv.tv_usec -= 1000000;
        tv.tv_sec += 1;
      }
      /* convert timeval to timespec */
      ts.tv_sec = tv.tv_sec;
      ts.tv_nsec = tv.tv_usec * 1000;

#ifdef PTHREAD_COND_TIMEDWAIT_USES_TIMEVAL
      timedout = (pthread_cond_timedwait(&event->cond, &event->mutex, &tv) == ETIMEDOUT);
#else
      timedout = (pthread_cond_timedwait(&event->cond, &event->mutex, &ts) == ETIMEDOUT);
#endif
    }
    if (!timedout)
    {
      event->signalled = 0;
    }
    pthread_mutex_unlock(&event->mutex);
  }

  return timedout;
}